

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOcontroller.h
# Opt level: O2

void IOcontroller::write_budget_order_seeds
               (string *outFileName,TResult *resultObj,string *outFolder,Graph *graph)

{
  ostream *poVar1;
  int i_1;
  int i;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  Nodelist vecSeed_inf_cost;
  Nodelist vecSeed_inf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> outpath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  ofstream outFile_inf_cost;
  ofstream outFile_inf;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&vecSeed_inf,&resultObj->__VecSeed_inf);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&vecSeed_inf_cost,&resultObj->__VecSeed_inf_cost);
  mkdir_absence((outFolder->_M_dataplus)._M_p);
  std::operator+(&outpath,outFolder,"/seed");
  mkdir_absence(outpath._M_dataplus._M_p);
  std::operator+(&local_4e0,&outpath,"/seed_");
  std::operator+(&local_4c0,&local_4e0,outFileName);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &outFile_inf_cost,&local_4c0,"_inf");
  std::ofstream::ofstream(&outFile_inf,(string *)&outFile_inf_cost,_S_out);
  std::__cxx11::string::~string((string *)&outFile_inf_cost);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::__cxx11::string::~string((string *)&local_4e0);
  for (uVar2 = 0;
      uVar2 < (ulong)((long)vecSeed_inf.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)vecSeed_inf.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2); uVar2 = uVar2 + 1) {
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&outFile_inf);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,'\n');
  }
  std::ofstream::close();
  std::operator+(&local_450,&outpath,"/seed_");
  std::operator+(&local_4e0,&local_450,outFileName);
  std::operator+(&local_4c0,&local_4e0,"_inf_cost");
  std::ofstream::ofstream(&outFile_inf_cost,(string *)&local_4c0,_S_out);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::__cxx11::string::~string((string *)&local_450);
  for (uVar2 = 0;
      uVar2 < (ulong)((long)vecSeed_inf_cost.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)vecSeed_inf_cost.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2); uVar2 = uVar2 + 1) {
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&outFile_inf_cost);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,'\n');
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&outFile_inf_cost);
  std::ofstream::~ofstream(&outFile_inf);
  std::__cxx11::string::~string((string *)&outpath);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&vecSeed_inf_cost.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&vecSeed_inf.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

static void write_budget_order_seeds(const std::string & outFileName, const TResult & resultObj,
            const std::string & outFolder, const Graph & graph) {
        auto vecSeed_inf = resultObj.get_seed_inf_vec();
        auto vecSeed_inf_cost = resultObj.get_seed_inf_cost_vec();
        mkdir_absence(outFolder.c_str());
        const auto outpath = outFolder + "/seed";
        mkdir_absence(outpath.c_str());
        std::ofstream outFile_inf(outpath + "/seed_" + outFileName + "_inf");
        for (auto i = 0; i < vecSeed_inf.size(); i++)
        {
            outFile_inf << vecSeed_inf[i] << " " << graph[i].size() << '\n';
        }
        outFile_inf.close();
        std::ofstream outFile_inf_cost(outpath + "/seed_" + outFileName + "_inf_cost");
        for (auto i = 0; i < vecSeed_inf_cost.size(); i++)
        {
            outFile_inf_cost << vecSeed_inf_cost[i] << " " << graph[i].size() << '\n';
        }
        outFile_inf_cost.close();
    }